

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O0

binarydata *
NetworkDataType::
serializedata<std::__cxx11::string_const,int_const,int_const,std::vector<NDeviceChannel,std::allocator<NDeviceChannel>>const>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,int *args_1,
          int *args_2,vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *args_3)

{
  Options OVar1;
  binarydata *in_RDI;
  PortableBinaryOutputArchive archive;
  ostringstream stream;
  string *in_stack_fffffffffffffcf8;
  binarydata *args_2_00;
  undefined7 in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  OutputArchive<cereal::PortableBinaryOutputArchive,_1U> *in_stack_fffffffffffffd20;
  Options *in_stack_fffffffffffffd30;
  ostream *in_stack_fffffffffffffd38;
  PortableBinaryOutputArchive *in_stack_fffffffffffffd40;
  ostringstream local_1a0 [416];
  
  args_2_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  OVar1 = cereal::PortableBinaryOutputArchive::Options::Default();
  cereal::PortableBinaryOutputArchive::PortableBinaryOutputArchive
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  cereal::OutputArchive<cereal::PortableBinaryOutputArchive,1u>::operator()
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             (int *)CONCAT17(OVar1.itsOutputEndianness,in_stack_fffffffffffffd10),(int *)args_2_00,
             (vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *)in_RDI);
  std::__cxx11::ostringstream::str();
  binarydata::binarydata(in_RDI,in_stack_fffffffffffffcf8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd18);
  cereal::PortableBinaryOutputArchive::~PortableBinaryOutputArchive
            ((PortableBinaryOutputArchive *)0x1e0afa);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return args_2_00;
}

Assistant:

static binarydata serializedata(T & ... args){
        std::ostringstream stream;
        cereal::PortableBinaryOutputArchive archive(stream);
        archive(args...);
        return binarydata(stream.str());
    }